

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

NodeTranslator * __thiscall
kj::Arena::
allocate<capnp::compiler::NodeTranslator,capnp::compiler::Compiler::Node&,capnp::compiler::ErrorReporter&,capnp::compiler::Declaration::Reader&,capnp::Orphan<capnp::schema::Node>,bool>
          (Arena *this,Node *params,ErrorReporter *params_1,Reader *params_2,
          Orphan<capnp::schema::Node> *params_3,bool *params_4)

{
  NodeTranslator *location;
  
  location = (NodeTranslator *)allocateBytes(this,0xd8,8,true);
  ctor<capnp::compiler::NodeTranslator,capnp::compiler::Compiler::Node&,capnp::compiler::ErrorReporter&,capnp::compiler::Declaration::Reader&,capnp::Orphan<capnp::schema::Node>,bool>
            (location,params,params_1,params_2,params_3,params_4);
  setDestructor(this,location,destroyObject<capnp::compiler::NodeTranslator>);
  return location;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !__has_trivial_destructor(T)));
  if (!__has_trivial_constructor(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!__has_trivial_destructor(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}